

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbcursor.cpp
# Opt level: O1

void __thiscall QXcbCursorCacheKey::QXcbCursorCacheKey(QXcbCursorCacheKey *this,QCursor *c)

{
  CursorShape CVar1;
  qint32 qVar2;
  long lVar3;
  qint64 qVar4;
  qint32 extraout_var;
  long in_FS_OFFSET;
  QPixmap local_40 [24];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  CVar1 = QCursor::shape();
  this->shape = CVar1;
  this->bitmapCacheKey = 0;
  this->maskCacheKey = 0;
  if (CVar1 == BitmapCursor) {
    QCursor::pixmap();
    lVar3 = QPixmap::cacheKey();
    QPixmap::~QPixmap(local_40);
    if (lVar3 == 0) {
      QCursor::bitmap();
      qVar4 = QPixmap::cacheKey();
      this->bitmapCacheKey = qVar4;
      QBitmap::~QBitmap((QBitmap *)local_40);
      QCursor::mask();
      qVar4 = QPixmap::cacheKey();
      this->maskCacheKey = qVar4;
      QBitmap::~QBitmap((QBitmap *)local_40);
    }
    else {
      this->bitmapCacheKey = lVar3;
    }
  }
  qVar2 = QCursor::hotSpot();
  (this->hotspotCacheKey).field_1.x = qVar2;
  QCursor::hotSpot();
  (this->hotspotCacheKey).field_1.y = extraout_var;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QXcbCursorCacheKey::QXcbCursorCacheKey(const QCursor &c)
    : shape(c.shape()), bitmapCacheKey(0), maskCacheKey(0)
{
    if (shape == Qt::BitmapCursor) {
        const qint64 pixmapCacheKey = c.pixmap().cacheKey();
        if (pixmapCacheKey) {
            bitmapCacheKey = pixmapCacheKey;
        } else {
            Q_ASSERT(!c.bitmap().isNull());
            Q_ASSERT(!c.mask().isNull());
            bitmapCacheKey = c.bitmap().cacheKey();
            maskCacheKey = c.mask().cacheKey();
        }
    }
    hotspotCacheKey.x = c.hotSpot().x();
    hotspotCacheKey.y = c.hotSpot().y();
}